

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IsEnabledStateTestCase::iterate
          (IsEnabledStateTestCase *this)

{
  bool bVar1;
  deBool dVar2;
  ContextType ctxType;
  GLenum GVar3;
  RenderContext *pRVar4;
  NotSupportedError *this_00;
  TestLog *log;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  IsEnabledStateTestCase *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," // ERROR: ",&local_99);
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,log,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
      gls::StateQueryUtil::verifyStateBoolean
                ((ResultCollector *)local_78,&this->super_CallLogWrapper,
                 *(GLenum *)&(this->super_CallLogWrapper).field_0x14,(bool)(this->m_initial & 1),
                 this->m_verifier);
      do {
        glu::CallLogWrapper::glEnable
                  (&this->super_CallLogWrapper,*(GLenum *)&(this->super_CallLogWrapper).field_0x14);
        GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
        glu::checkError(GVar3,"glEnable(m_targetName)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
                        ,0x53);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      gls::StateQueryUtil::verifyStateBoolean
                ((ResultCollector *)local_78,&this->super_CallLogWrapper,
                 *(GLenum *)&(this->super_CallLogWrapper).field_0x14,true,this->m_verifier);
      do {
        glu::CallLogWrapper::glDisable
                  (&this->super_CallLogWrapper,*(GLenum *)&(this->super_CallLogWrapper).field_0x14);
        GVar3 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
        glu::checkError(GVar3,"glDisable(m_targetName)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
                        ,0x57);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      gls::StateQueryUtil::verifyStateBoolean
                ((ResultCollector *)local_78,&this->super_CallLogWrapper,
                 *(GLenum *)&(this->super_CallLogWrapper).field_0x14,false,this->m_verifier);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"This test requires a higher context version.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
             ,0x49);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

IterateResult iterate (void)
	{
		TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "This test requires a higher context version.");

		tcu::ResultCollector result(m_testCtx.getLog(), " // ERROR: ");
		enableLogging(true);

		// check inital value
		verifyStateBoolean(result, *this, m_targetName, m_initial, m_verifier);

		// check toggle

		GLU_CHECK_CALL(glEnable(m_targetName));

		verifyStateBoolean(result, *this, m_targetName, true, m_verifier);

		GLU_CHECK_CALL(glDisable(m_targetName));

		verifyStateBoolean(result, *this, m_targetName, false, m_verifier);

		result.setTestContextResult(m_testCtx);
		return STOP;
	}